

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O3

void __thiscall
crnlib::threaded_resampler::resample_y_task(threaded_resampler *this,uint64 data,void *param_2)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  pixel_format pVar9;
  vec<4U,_float> *pvVar10;
  Contrib *pCVar11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  vec<4U,_float> *pvVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint *puVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  params *ppVar25;
  long lVar26;
  float fVar27;
  vector<crnlib::vec<4U,_float>_> tmp;
  elemental_vector local_48;
  Contrib_List *local_38;
  
  ppVar25 = this->m_pParams;
  uVar7 = ppVar25->m_dst_width;
  local_48.m_p = (vec<4U,_float> *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  if (uVar7 != 0) {
    elemental_vector::increase_capacity(&local_48,uVar7,uVar7 == 1,0x10,(object_mover)0x0,false);
    local_48.m_size = uVar7;
    ppVar25 = this->m_pParams;
  }
  uVar8 = ppVar25->m_dst_height;
  if ((ulong)uVar8 != 0) {
    local_38 = this->m_pY_contribs;
    uVar7 = this->m_pTask_pool->m_num_threads;
    pvVar10 = (this->m_tmp_img).m_p;
    uVar19 = 0;
    do {
      iVar18 = (int)uVar19;
      if ((uVar7 == 0) || ((int)((uVar19 & 0xffffffff) % (ulong)(uVar7 + 1)) == (int)data)) {
        uVar16 = (ulong)local_38[uVar19].n;
        if (uVar16 == 1) {
          uVar20 = (ulong)ppVar25->m_dst_width;
          pvVar17 = pvVar10 + (uint)(local_38[uVar19].p)->pixel * ppVar25->m_dst_width;
        }
        else {
          uVar23 = ppVar25->m_dst_width;
          uVar20 = (ulong)uVar23;
          pvVar17 = (vec<4U,_float> *)local_48.m_p;
          if (uVar16 != 0) {
            pCVar11 = local_38[uVar19].p;
            uVar24 = 0;
            do {
              uVar22 = pCVar11[uVar24].pixel * uVar23;
              fVar4 = pCVar11[uVar24].weight;
              if (uVar24 == 0) {
                if (uVar23 != 0) {
                  lVar26 = 0;
                  do {
                    pfVar1 = (float *)((long)pvVar10[uVar22].m_s + lVar26);
                    fVar5 = pfVar1[1];
                    fVar6 = pfVar1[2];
                    fVar27 = pfVar1[3];
                    pfVar2 = (float *)((long)(float *)local_48.m_p + lVar26);
                    *pfVar2 = *pfVar1 * fVar4;
                    pfVar2[1] = fVar5 * fVar4;
                    pfVar2[2] = fVar6 * fVar4;
                    pfVar2[3] = fVar27 * fVar4;
                    lVar26 = lVar26 + 0x10;
                  } while (uVar20 << 4 != lVar26);
                }
              }
              else if (uVar23 != 0) {
                lVar26 = 0;
                do {
                  pfVar1 = (float *)((long)pvVar10[uVar22].m_s + lVar26);
                  fVar5 = pfVar1[1];
                  fVar6 = pfVar1[2];
                  fVar27 = pfVar1[3];
                  pfVar2 = (float *)((long)(float *)local_48.m_p + lVar26);
                  fVar13 = pfVar2[1];
                  fVar14 = pfVar2[2];
                  fVar15 = pfVar2[3];
                  pfVar3 = (float *)((long)(float *)local_48.m_p + lVar26);
                  *pfVar3 = *pfVar2 + *pfVar1 * fVar4;
                  pfVar3[1] = fVar13 + fVar5 * fVar4;
                  pfVar3[2] = fVar14 + fVar6 * fVar4;
                  pfVar3[3] = fVar15 + fVar27 * fVar4;
                  lVar26 = lVar26 + 0x10;
                } while (uVar20 << 4 != lVar26);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar16);
          }
        }
        fVar4 = ppVar25->m_sample_low;
        fVar5 = ppVar25->m_sample_high;
        pVar9 = ppVar25->m_fmt;
        if (pVar9 == cPF_RGBA_F32) {
          uVar23 = ppVar25->m_dst_pitch * iVar18;
          pvVar12 = ppVar25->m_pDst_pixels;
          lVar26 = 0;
          do {
            pfVar1 = (float *)((long)pvVar17->m_s + lVar26);
            fVar6 = *pfVar1;
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            fVar6 = pfVar1[1];
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23 + 4) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            fVar6 = pfVar1[2];
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23 + 8) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            fVar6 = pfVar1[3];
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23 + 0xc) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            lVar26 = lVar26 + 0x10;
          } while ((vec<4U,_float> *)(pfVar1 + 4) != pvVar17 + uVar20);
        }
        else if (pVar9 == cPF_RGBX_F32) {
          uVar23 = ppVar25->m_dst_pitch * iVar18;
          pvVar12 = ppVar25->m_pDst_pixels;
          lVar26 = 0;
          do {
            pfVar1 = (float *)((long)pvVar17->m_s + lVar26);
            fVar6 = *pfVar1;
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            fVar6 = pfVar1[1];
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23 + 4) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            fVar6 = pfVar1[2];
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *(uint *)((long)pvVar12 + lVar26 + (ulong)uVar23 + 8) =
                 -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27;
            *(float *)((long)pvVar12 + lVar26 + (ulong)uVar23 + 0xc) = fVar5;
            lVar26 = lVar26 + 0x10;
          } while ((vec<4U,_float> *)(pfVar1 + 4) != pvVar17 + uVar20);
        }
        else if (pVar9 == cPF_Y_F32) {
          puVar21 = (uint *)((ulong)(ppVar25->m_dst_pitch * iVar18) + (long)ppVar25->m_pDst_pixels);
          lVar26 = 0;
          do {
            fVar6 = *(float *)((long)pvVar17->m_s + lVar26);
            fVar27 = fVar5;
            if (fVar6 <= fVar5) {
              fVar27 = fVar6;
            }
            *puVar21 = -(uint)(fVar6 < fVar4) & (uint)fVar4 | ~-(uint)(fVar6 < fVar4) & (uint)fVar27
            ;
            puVar21 = puVar21 + 1;
            lVar26 = lVar26 + 0x10;
          } while (uVar20 * 0x10 != lVar26);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar8);
  }
  if ((vec<4U,_float> *)local_48.m_p != (vec<4U,_float> *)0x0) {
    crnlib_free(local_48.m_p);
  }
  return;
}

Assistant:

void threaded_resampler::resample_y_task(uint64 data, void*)
    {
        const uint thread_index = (uint)data;

        crnlib::vector<vec4F> tmp(m_pParams->m_dst_width);

        for (uint dst_y = 0; dst_y < m_pParams->m_dst_height; dst_y++)
        {
            if (m_pTask_pool->get_num_threads())
            {
                if ((dst_y % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const Resampler::Contrib_List& contribs = m_pY_contribs[dst_y];

            const vec4F* pSrc;

            if (contribs.n == 1)
            {
                pSrc = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[0].pixel;
            }
            else
            {
                for (uint src_y_iter = 0; src_y_iter < contribs.n; src_y_iter++)
                {
                    const vec4F* p = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[src_y_iter].pixel;
                    const float weight = contribs.p[src_y_iter].weight;

                    if (!src_y_iter)
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] = p[i] * weight;
                        }
                    }
                    else
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] += p[i] * weight;
                        }
                    }
                }

                pSrc = tmp.get_ptr();
            }

            const vec4F* pSrc_end = pSrc + m_pParams->m_dst_width;

            const float l = m_pParams->m_sample_low;
            const float h = m_pParams->m_sample_high;

            switch (m_pParams->m_fmt)
            {
            case cPF_Y_F32:
            {
                float* pDst = reinterpret_cast<float*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    *pDst++ = math::clamp((*pSrc)[0], l, h);

                    pSrc++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBX_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = h;

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBA_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = math::clamp((*pSrc)[3], l, h);

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            default:
                break;
            }
        }
    }